

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

int Extra_bddSuppOverlapping(DdManager *dd,DdNode *S1,DdNode *S2)

{
  uint uVar1;
  uint uVar2;
  
  do {
    uVar1 = S1->index;
    while( true ) {
      if (uVar1 == 0x7fffffff) {
        return 0;
      }
      uVar2 = S2->index;
      if ((ulong)uVar2 == 0x7fffffff) {
        return 0;
      }
      if (uVar1 == uVar2) {
        return 1;
      }
      if (dd->perm[uVar1] < dd->perm[uVar2]) break;
      S2 = (S2->type).kids.T;
    }
    S1 = (S1->type).kids.T;
  } while( true );
}

Assistant:

int Extra_bddSuppOverlapping( DdManager * dd, DdNode * S1, DdNode * S2 )
{
    while ( S1->index != CUDD_CONST_INDEX && S2->index != CUDD_CONST_INDEX )
    {
        // if the top vars are the same, they intersect
        if ( S1->index == S2->index )
            return 1;
        // if the top vars are different, skip the one, which is higher
        if ( dd->perm[S1->index] < dd->perm[S2->index] )
            S1 = cuddT(S1);
        else
            S2 = cuddT(S2);
    }
    return 0;
}